

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

keypress inkey(void)

{
  undefined4 in_EDX;
  bool bVar1;
  ui_event uVar2;
  keypress kVar3;
  undefined8 local_40;
  ui_event_type local_38;
  mouseclick local_24;
  ui_event ke;
  
  uVar2._8_4_ = in_EDX;
  uVar2.mouse = (mouseclick)local_40;
  local_24.type = EVT_NONE;
  local_24.x = '\0';
  local_24.y = '\0';
  local_24.button = '\0';
  local_24.mods = '\0';
  ke.type = EVT_NONE;
  while( true ) {
    bVar1 = false;
    if (((local_24.type != EVT_ESCAPE) && (bVar1 = false, local_24.type != EVT_KBRD)) &&
       (bVar1 = false, local_24.type != EVT_MOUSE)) {
      bVar1 = local_24.type != EVT_BUTTON;
    }
    if (!bVar1) break;
    uVar2 = inkey_ex();
    local_24 = uVar2.mouse;
    local_38 = (ui_event_type)uVar2.key.mods;
    ke.type = local_38;
  }
  if (local_24.type == EVT_ESCAPE) {
    local_24.type = EVT_KBRD;
    local_24.x = '\0';
    local_24.y = 0xe0;
    local_24.button = '\0';
    local_24.mods = '\0';
    ke.type._0_1_ = 0;
  }
  else if (local_24.type == EVT_MOUSE) {
    if (local_24.button == '\x01') {
      local_24.type = EVT_KBRD;
      local_24.x = '\n';
      local_24.y = '\0';
      local_24.button = '\0';
      local_24.mods = '\0';
    }
    else {
      local_24.type = EVT_KBRD;
      local_24.x = '\0';
      local_24.y = 0xe0;
      local_24.button = '\0';
      local_24.mods = '\0';
    }
    ke.type._0_1_ = 0;
  }
  else if (local_24.type == EVT_BUTTON) {
    local_24.type = EVT_KBRD;
  }
  kVar3._9_3_ = uVar2._9_3_;
  kVar3.mods = ke.type._0_1_;
  kVar3._0_8_ = local_24;
  return kVar3;
}

Assistant:

struct keypress inkey(void)
{
	ui_event ke = EVENT_EMPTY;

	while (ke.type != EVT_ESCAPE && ke.type != EVT_KBRD &&
		   ke.type != EVT_MOUSE && ke.type != EVT_BUTTON)
		ke = inkey_ex();

	/* Make the event a keypress */
	if (ke.type == EVT_ESCAPE) {
		ke.type = EVT_KBRD;
		ke.key.code = ESCAPE;
		ke.key.mods = 0;
	} else if (ke.type == EVT_MOUSE) {
		if (ke.mouse.button == 1) {
			ke.type = EVT_KBRD;
			ke.key.code = '\n';
			ke.key.mods = 0;
		} else {
			ke.type = EVT_KBRD;
			ke.key.code = ESCAPE;
			ke.key.mods = 0;
		}
	} else if (ke.type == EVT_BUTTON) {
		ke.type = EVT_KBRD;
	}

	return ke.key;
}